

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O1

void __thiscall dgPolyhedra::Optimize(dgPolyhedra *this,HaF64 *array,HaI32 strideInBytes,HaF64 tol)

{
  dgRedBackNode *pdVar1;
  double dVar2;
  double dVar3;
  HaI32 i2;
  HaI32 HVar4;
  HaI32 HVar5;
  HaI32 *pHVar6;
  dgEdge *pdVar7;
  dgEdge *pdVar8;
  dgEdge *pdVar9;
  dgListNode *pdVar10;
  dgBigVector *pdVar11;
  dgVertexCollapseVertexMetric *__s;
  RECORD *pRVar12;
  dgPolyhedra *pdVar13;
  dgEdge *pdVar14;
  ulong uVar15;
  dgTreeNode *pdVar16;
  char *__function;
  dgEdge *pdVar17;
  dgEdge *pdVar18;
  ulong uVar19;
  uint uVar20;
  dgRedBackNode *pdVar21;
  dgEdge *edge;
  long lVar22;
  dgEdge **ppdVar23;
  dgEdge *pdVar24;
  ulong uVar25;
  dgEdge *pdVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  dgEdge *pdVar30;
  HaF64 *pHVar31;
  float fVar32;
  HaF64 HVar33;
  HaF64 HVar34;
  double dVar35;
  float fVar36;
  dgBigPlane constrainPlane;
  dgStack<dgBigVector> vertexPool;
  dgListNode *handleNodePtr;
  dgStack<dgVertexCollapseVertexMetric> vertexMetrics;
  Iterator iter_1;
  dgDownHeap<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double> bigHeapArray;
  Iterator iter;
  dgList<dgEdgeCollapseEdgeHandle> edgeHandleList;
  undefined1 local_138 [8];
  undefined8 local_130;
  double local_128;
  double local_120;
  dgStack<dgBigVector> local_118;
  dgEdge *local_108;
  dgListNode *local_100;
  double local_f8;
  dgStack<dgVertexCollapseVertexMetric> local_f0;
  dgRedBackNode *local_e0;
  dgEdge *local_d8;
  dgDownHeap<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double> local_d0;
  dgEdge *local_c0;
  dgVertexCollapseVertexMetric local_b8;
  RECORD *local_68;
  dgList<dgEdgeCollapseEdgeHandle> local_60;
  _func_int **local_40;
  dgEdge *local_38;
  
  iVar27 = (this->super_dgTree<dgEdge,_long>).m_count;
  local_b8.elem[0] = 0.0;
  pdVar16 = (this->super_dgTree<dgEdge,_long>).m_head;
  uVar29 = 0;
  local_108 = (dgEdge *)this;
  local_f8 = (double)tol;
  local_b8.elem[1] = (HaF64)this;
  if (pdVar16 == (dgTreeNode *)0x0) {
    local_b8.elem[0] = 0.0;
  }
  else {
    local_b8.elem[0] = (HaF64)dgRedBackNode::Minimum(&pdVar16->super_dgRedBackNode);
  }
  if ((dgRedBackNode *)local_b8.elem[0] != (dgRedBackNode *)0x0) {
    iVar28 = -1;
    do {
      if (iVar28 < *(int *)&((dgRedBackNode *)((long)local_b8.elem[0] + 0x28))->_vptr_dgRedBackNode)
      {
        iVar28 = *(int *)&((dgRedBackNode *)((long)local_b8.elem[0] + 0x28))->_vptr_dgRedBackNode;
      }
      dgTree<dgEdge,_long>::Iterator::operator++((Iterator *)&local_b8,0);
    } while ((dgRedBackNode *)local_b8.elem[0] != (dgRedBackNode *)0x0);
    uVar29 = iVar28 + 1;
  }
  pdVar11 = (dgBigVector *)malloc((long)(int)(uVar29 << 5));
  local_118.super_dgStackBase.m_ptr = pdVar11;
  local_118.m_size = uVar29;
  __s = (dgVertexCollapseVertexMetric *)malloc((long)(int)((uVar29 + 0x200) * 0x50));
  local_40 = (_func_int **)&PTR__dgList_00b6ab00;
  local_60._vptr_dgList = (_func_int **)&PTR__dgList_00b6ab00;
  local_60.m_count = 0;
  local_60.m_last = (dgListNode *)0x0;
  local_60.m_first = (dgListNode *)0x0;
  uVar20 = iVar27 * 0xa0 + 0xa0000;
  local_f0.super_dgStackBase.m_ptr = __s;
  local_f0.m_size = uVar29 + 0x200;
  pRVar12 = (RECORD *)malloc((long)(int)uVar20);
  if (-1 < (int)uVar20) {
    local_d0.super_dgHeapBase<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double>.m_maxCount =
         uVar20 >> 4;
    local_d0.super_dgHeapBase<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double>.m_curCount = 0
    ;
    if (uVar29 != 0) {
      pHVar31 = array + 2;
      lVar22 = 0;
      do {
        *(HaF64 *)((long)&(pdVar11->super_dgTemplateVector<double>).m_x + lVar22) = pHVar31[-2];
        *(HaF64 *)((long)&(pdVar11->super_dgTemplateVector<double>).m_y + lVar22) = pHVar31[-1];
        *(HaF64 *)((long)&(pdVar11->super_dgTemplateVector<double>).m_z + lVar22) = *pHVar31;
        *(undefined8 *)((long)&(pdVar11->super_dgTemplateVector<double>).m_w + lVar22) = 0;
        lVar22 = lVar22 + 0x20;
        pHVar31 = pHVar31 + (strideInBytes >> 3);
      } while ((ulong)uVar29 << 5 != lVar22);
    }
    local_d0.super_dgHeapBase<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double>.m_pool =
         pRVar12;
    local_68 = pRVar12;
    memset(__s,0,(ulong)uVar29 * 0x50);
    iVar27 = *(int *)((long)&local_108->m_prev + 4) + 1;
    *(int *)((long)&local_108->m_prev + 4) = iVar27;
    if (iVar27 == 0x7fffffff) {
LAB_0087de10:
      __assert_fail("m_edgeMark < 0x7fffffff",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.h"
                    ,0xe5,"hacd::HaI32 dgPolyhedra::IncLRU() const");
    }
    local_e0 = (dgRedBackNode *)0x0;
    local_d8 = local_108;
    if (local_108->m_next == (dgEdge *)0x0) {
      local_e0 = (dgRedBackNode *)0x0;
    }
    else {
      local_e0 = dgRedBackNode::Minimum((dgRedBackNode *)local_108->m_next);
    }
    if (local_e0 != (dgRedBackNode *)0x0) {
      do {
        pdVar1 = local_e0;
        if (*(int *)&local_e0[2]._vptr_dgRedBackNode != iVar27) {
          if (*(int *)((long)&local_e0[1]._vptr_dgRedBackNode + 4) < 1) {
            pHVar6 = *(HaI32 **)&local_e0[1].field_0x20;
            if (pHVar6[1] < 1) {
              __assert_fail("edge->m_twin->m_incidentFace > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                            ,0x993,
                            "void CalculateAllMetrics(const dgPolyhedra *const, dgVertexCollapseVertexMetric *const, const dgBigVector *const)"
                           );
            }
            HVar4 = *pHVar6;
            HVar5 = **(HaI32 **)(pHVar6 + 4);
            i2 = **(HaI32 **)(pHVar6 + 6);
            *(int *)&local_e0[2]._vptr_dgRedBackNode = iVar27;
            UnboundedLoopPlane((dgBigPlane *)local_138,HVar4,HVar5,i2,pdVar11);
            local_b8.elem[6] = (HaF64)CONCAT44(local_138._4_4_,local_138._0_4_);
            local_b8.elem[0] = (HaF64)((double)local_b8.elem[6] * (double)local_b8.elem[6]);
            local_b8.elem[1] = (HaF64)((double)local_130 * (double)local_130);
            local_b8.elem[2] = (HaF64)(local_128 * local_128);
            local_b8.elem[3] = (HaF64)(local_120 * local_120);
            local_b8.elem[6] = (HaF64)((double)local_b8.elem[6] + (double)local_b8.elem[6]);
            local_b8.elem[4] = (HaF64)((double)local_b8.elem[6] * (double)local_130);
            local_b8.elem[5] = (HaF64)((double)local_b8.elem[6] * local_128);
            local_b8.elem[6] = (HaF64)((double)local_b8.elem[6] * local_120);
            local_b8.elem[7] = (HaF64)(((double)local_130 + (double)local_130) * local_128);
            local_b8.elem[8] = (HaF64)(((double)local_130 + (double)local_130) * local_120);
            local_b8.elem[9] = (HaF64)((local_128 + local_128) * local_120);
            dgVertexCollapseVertexMetric::Accumulate
                      (__s + *(int *)&pdVar1[1]._vptr_dgRedBackNode,&local_b8);
            dgVertexCollapseVertexMetric::Accumulate
                      (__s + **(int **)&pdVar1[1].field_0x20,&local_b8);
          }
          else {
            pdVar1 = local_e0 + 1;
            EdgePlane((dgBigPlane *)local_138,*(HaI32 *)&local_e0[1]._vptr_dgRedBackNode,
                      *(HaI32 *)&(local_e0[1].m_right)->_vptr_dgRedBackNode,
                      *(HaI32 *)&(local_e0[1].m_parent)->_vptr_dgRedBackNode,pdVar11);
            local_b8.elem[6] = (HaF64)CONCAT44(local_138._4_4_,local_138._0_4_);
            local_b8.elem[0] = (HaF64)((double)local_b8.elem[6] * (double)local_b8.elem[6]);
            local_b8.elem[1] = (HaF64)((double)local_130 * (double)local_130);
            local_b8.elem[2] = (HaF64)(local_128 * local_128);
            local_b8.elem[3] = (HaF64)(local_120 * local_120);
            local_b8.elem[6] = (HaF64)((double)local_b8.elem[6] + (double)local_b8.elem[6]);
            local_b8.elem[4] = (HaF64)((double)local_b8.elem[6] * (double)local_130);
            local_b8.elem[5] = (HaF64)((double)local_b8.elem[6] * local_128);
            local_b8.elem[6] = (HaF64)((double)local_b8.elem[6] * local_120);
            local_b8.elem[7] = (HaF64)(((double)local_130 + (double)local_130) * local_128);
            local_b8.elem[8] = (HaF64)(((double)local_130 + (double)local_130) * local_120);
            local_b8.elem[9] = (HaF64)((local_128 + local_128) * local_120);
            pdVar21 = pdVar1;
            do {
              *(int *)&pdVar21[1]._vptr_dgRedBackNode = iVar27;
              dgVertexCollapseVertexMetric::Accumulate
                        (__s + *(int *)&pdVar21->_vptr_dgRedBackNode,&local_b8);
              pdVar21 = pdVar21->m_right;
            } while (pdVar21 != pdVar1);
          }
        }
        dgTree<dgEdge,_long>::Iterator::operator++((Iterator *)&local_e0,0);
      } while (local_e0 != (dgRedBackNode *)0x0);
    }
    local_b8.elem[0] = 0.0;
    local_b8.elem[1] = (HaF64)local_108;
    if (local_108->m_next == (dgEdge *)0x0) {
      local_b8.elem[0] = 0.0;
    }
    else {
      local_b8.elem[0] = (HaF64)dgRedBackNode::Minimum((dgRedBackNode *)local_108->m_next);
    }
    local_f8 = local_f8 * local_f8;
    while (HVar34 = local_b8.elem[0], (dgRedBackNode *)local_b8.elem[0] != (dgRedBackNode *)0x0) {
      ((dgRedBackNode *)((long)local_b8.elem[0] + 0x28))->m_left = (dgRedBackNode *)0x0;
      HVar4 = **(HaI32 **)&((dgRedBackNode *)((long)local_b8.elem[0] + 0x28))->field_0x20;
      pdVar13 = (dgPolyhedra *)
                dgStack<dgVertexCollapseVertexMetric>::operator[]
                          (&local_f0,
                           *(HaI32 *)&((dgRedBackNode *)((long)local_b8.elem[0] + 0x28))->
                                      _vptr_dgRedBackNode);
      pdVar11 = dgStack<dgBigVector>::operator[](&local_118,HVar4);
      dVar35 = (pdVar11->super_dgTemplateVector<double>).m_x;
      dVar2 = (pdVar11->super_dgTemplateVector<double>).m_y;
      dVar3 = (pdVar11->super_dgTemplateVector<double>).m_z;
      if (((0x7fefffffffffffff < (ulong)ABS(dVar35)) || (0x7fefffffffffffff < (ulong)ABS(dVar2))) ||
         ((NAN(dVar2) || ((0x7fefffffffffffff < (ulong)ABS(dVar3) || (NAN(dVar3))))))) {
        __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                      ,0x152,"dgBigVector::dgBigVector(const hacd::HaF64 *)");
      }
      local_138._0_4_ = (undefined4)dVar35;
      local_138._4_4_ = (undefined4)dVar2;
      fVar32 = (float)dVar3;
      local_130 = (dgEdge *)(ulong)(uint)fVar32;
      if ((((0x7f7fffff < (uint)ABS((float)local_138._0_4_)) ||
           (0x7f7fffff < (uint)ABS((float)local_138._4_4_))) || (NAN((float)local_138._4_4_))) ||
         ((0x7f7fffff < (uint)ABS(fVar32) || (NAN(fVar32))))) goto LAB_0087dd01;
      HVar33 = dgVertexCollapseVertexMetric::Evalue
                         ((dgVertexCollapseVertexMetric *)pdVar13,(dgVector *)local_138);
      if ((double)HVar33 < local_f8) {
        if (local_118.m_size < 0) goto LAB_0087dd20;
        HVar33 = EdgePenalty(pdVar13,(dgBigVector *)local_118.super_dgStackBase.m_ptr,
                             (dgEdge *)((long)HVar34 + 0x28));
        if (0.0 < (double)HVar33) {
          local_e0 = (dgRedBackNode *)((ulong)local_e0 & 0xffffffff00000000);
          local_d8 = (dgEdge *)((long)HVar34 + 0x28);
          local_100 = dgList<dgEdgeCollapseEdgeHandle>::Addtop
                                (&local_60,(dgEdgeCollapseEdgeHandle *)&local_e0);
          dgDownHeap<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double>::Push
                    (&local_d0,&local_100,(double)HVar33);
          if ((((HaU32)local_e0 != 0) && (local_d8 != (dgEdge *)0x0)) &&
             (&local_e0 == (dgRedBackNode **)local_d8->m_userData)) {
            local_d8->m_userData = 0;
          }
        }
      }
      dgTree<dgEdge,_long>::Iterator::operator++((Iterator *)&local_b8,0);
    }
LAB_0087dc9d:
    do {
      if (local_d0.super_dgHeapBase<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double>.
          m_curCount == 0) {
        free(local_d0.super_dgHeapBase<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double>.
             m_pool);
        free(local_68);
        local_60._vptr_dgList = local_40;
        dgList<dgEdgeCollapseEdgeHandle>::RemoveAll(&local_60);
        free(local_f0.super_dgStackBase.m_ptr);
        free(local_118.super_dgStackBase.m_ptr);
        return;
      }
      if (local_d0.super_dgHeapBase<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double>.
          m_curCount < 0) {
        __assert_fail("i<= m_curCount",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgHeap.h"
                      ,0xcd,
                      "const OBJECT &dgHeapBase<dgList<dgEdgeCollapseEdgeHandle>::dgListNode *, double>::operator[](hacd::HaI32) const [OBJECT = dgList<dgEdgeCollapseEdgeHandle>::dgListNode *, KEY = double]"
                     );
      }
      local_100 = *(dgListNode **)
                   (local_d0.
                    super_dgHeapBase<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double>.m_pool
                   + 8);
      pdVar14 = (local_100->m_info).m_edge;
      dgDownHeap<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double>::Pop(&local_d0);
      pdVar10 = local_100;
      dgList<dgEdgeCollapseEdgeHandle>::Unlink(&local_60,local_100);
      if (pdVar10 != (dgListNode *)0x0) {
        (*pdVar10->_vptr_dgListNode[1])(pdVar10);
      }
    } while (pdVar14 == (dgEdge *)0x0);
    if (local_f0.m_size < 0) goto LAB_0087dd3f;
    if (-1 < local_118.m_size) goto code_r0x0087d31a;
    goto LAB_0087dd20;
  }
  __function = "T &dgStack<char>::operator[](hacd::HaI32) [T = char]";
LAB_0087dd35:
  __assert_fail("(entry < m_size) || ((m_size == 0) && (entry == 0))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgStack.h"
                ,0x60,__function);
code_r0x0087d31a:
  CalculateVertexMetrics
            ((dgVertexCollapseVertexMetric *)local_f0.super_dgStackBase.m_ptr,
             (dgBigVector *)local_118.super_dgStackBase.m_ptr,pdVar14);
  HVar4 = pdVar14->m_twin->m_incidentVertex;
  pdVar13 = (dgPolyhedra *)
            dgStack<dgVertexCollapseVertexMetric>::operator[](&local_f0,pdVar14->m_incidentVertex);
  pdVar11 = dgStack<dgBigVector>::operator[](&local_118,HVar4);
  local_138._0_4_ = (undefined4)(pdVar11->super_dgTemplateVector<double>).m_x;
  local_138._4_4_ = (undefined4)(pdVar11->super_dgTemplateVector<double>).m_y;
  fVar36 = (float)(pdVar11->super_dgTemplateVector<double>).m_z;
  fVar32 = (float)(pdVar11->super_dgTemplateVector<double>).m_w;
  local_130 = (dgEdge *)CONCAT44(fVar32,fVar36);
  if (((((0x7f7fffff < (uint)ABS((float)local_138._0_4_)) ||
        (0x7f7fffff < (uint)ABS((float)local_138._4_4_))) || (NAN((float)local_138._4_4_))) ||
      ((0x7f7fffff < (uint)ABS(fVar36) || (NAN(fVar36))))) ||
     ((0x7f7fffff < (uint)ABS(fVar32) || (NAN(fVar32))))) {
LAB_0087dd01:
    __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                  ,0x12d,"dgVector::dgVector(const dgBigVector &)");
  }
  HVar34 = dgVertexCollapseVertexMetric::Evalue
                     ((dgVertexCollapseVertexMetric *)pdVar13,(dgVector *)local_138);
  if (local_f8 <= (double)HVar34) goto LAB_0087dc9d;
  if (local_118.m_size < 0) goto LAB_0087dd20;
  HVar34 = EdgePenalty(pdVar13,(dgBigVector *)local_118.super_dgStackBase.m_ptr,pdVar14);
  pdVar18 = local_108;
  if ((double)HVar34 <= 0.0) goto LAB_0087dc9d;
  pdVar30 = pdVar14->m_twin;
  pdVar7 = pdVar30->m_prev;
  pdVar8 = pdVar7->m_twin;
  pdVar9 = pdVar30->m_next;
  if (pdVar8 != pdVar30 && pdVar8 != pdVar9) {
    iVar27 = pdVar14->m_incidentVertex;
    iVar28 = pdVar30->m_incidentVertex;
    edge = pdVar8;
    if ((pdVar8 != pdVar14->m_next) ||
       (edge = pdVar14->m_prev->m_twin, edge != pdVar30 && edge != pdVar9)) {
      local_c0 = (dgEdge *)&pdVar30->m_next;
      if ((pdVar14->m_incidentFace < 0) || (pdVar30->m_incidentFace < 0)) {
        if (pdVar30->m_incidentFace < 0) {
          pdVar17 = pdVar14->m_prev->m_twin;
          ppdVar23 = (dgEdge **)local_c0;
        }
        else {
          pdVar17 = pdVar14;
          ppdVar23 = &pdVar9->m_twin->m_next;
        }
      }
      else {
        pdVar17 = pdVar14->m_prev->m_twin;
        ppdVar23 = &pdVar9->m_twin->m_next;
      }
      uVar19 = (ulong)iVar28;
      pdVar24 = *ppdVar23;
      if (pdVar24 != pdVar17) {
        do {
          if (local_108->m_next != (dgEdge *)0x0) {
            uVar25 = (long)pdVar24->m_twin->m_incidentVertex | uVar19 << 0x20;
            pdVar26 = local_108->m_next;
            do {
              lVar22 = 8;
              if ((*(long *)&pdVar26[1].m_mark <= (long)uVar25) &&
                 (lVar22 = 0x10, (long)uVar25 <= *(long *)&pdVar26[1].m_mark)) goto LAB_0087d45d;
              pdVar26 = *(dgEdge **)((long)&pdVar26->m_incidentVertex + lVar22);
            } while (pdVar26 != (dgEdge *)0x0);
          }
          pdVar24 = pdVar24->m_twin->m_next;
        } while (pdVar24 != pdVar17);
      }
      if (pdVar9 == pdVar7->m_prev) {
        pdVar8->m_twin = pdVar9->m_twin;
        pdVar9->m_twin->m_twin = pdVar7->m_twin;
        RemoveHalfEdge((dgPolyhedra *)local_108,pdVar7);
        RemoveHalfEdge((dgPolyhedra *)pdVar18,*(dgEdge **)local_c0);
      }
      else {
        pdVar9->m_prev = pdVar7;
        pdVar30->m_prev->m_next = pdVar9;
      }
      pdVar7 = pdVar14->m_next;
      pdVar8 = pdVar14->m_prev;
      if (pdVar7 == pdVar8->m_prev) {
        pdVar7->m_twin->m_twin = pdVar8->m_twin;
        pdVar8->m_twin->m_twin = pdVar7->m_twin;
        RemoveHalfEdge((dgPolyhedra *)pdVar18,pdVar7);
        RemoveHalfEdge((dgPolyhedra *)pdVar18,pdVar14->m_prev);
      }
      else {
        pdVar7->m_prev = pdVar8;
        pdVar14->m_prev->m_next = pdVar7;
      }
      if (pdVar30->m_twin->m_incidentVertex != iVar27) {
        __assert_fail("twin->m_twin->m_incidentVertex == v0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                      ,0xaa0,"dgEdge *CollapseEdge(dgPolyhedra *const, dgEdge *const)");
      }
      if (pdVar14->m_twin->m_incidentVertex != iVar28) {
        __assert_fail("edge->m_twin->m_incidentVertex == v1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                      ,0xaa1,"dgEdge *CollapseEdge(dgPolyhedra *const, dgEdge *const)");
      }
      RemoveHalfEdge((dgPolyhedra *)pdVar18,pdVar30);
      RemoveHalfEdge((dgPolyhedra *)pdVar18,pdVar14);
      pdVar14 = edge;
      do {
        uVar25 = (ulong)pdVar14->m_twin->m_incidentVertex;
        pdVar16 = (dgTreeNode *)local_108->m_next;
        if (pdVar16 == (dgTreeNode *)0x0) {
          pdVar16 = (dgTreeNode *)0x0;
        }
        else {
          uVar15 = (long)iVar27 << 0x20 | uVar25;
          do {
            lVar22 = 8;
            if ((pdVar16->m_key <= (long)uVar15) && (lVar22 = 0x10, (long)uVar15 <= pdVar16->m_key))
            break;
            pdVar16 = *(dgTreeNode **)
                       ((long)&(pdVar16->super_dgRedBackNode)._vptr_dgRedBackNode + lVar22);
          } while (pdVar16 != (dgTreeNode *)0x0);
        }
        if ((pdVar16 != (dgTreeNode *)0x0) && (&pdVar16->m_info == pdVar14)) {
          pdVar14->m_incidentVertex = iVar28;
          pdVar16 = dgTree<dgEdge,_long>::ReplaceKey
                              ((dgTree<dgEdge,_long> *)local_108,pdVar16,uVar25 | uVar19 << 0x20);
          if (pdVar16 == (dgTreeNode *)0x0) {
            __assert_fail("node",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                          ,0xaaf,"dgEdge *CollapseEdge(dgPolyhedra *const, dgEdge *const)");
          }
        }
        uVar25 = (ulong)(uint)pdVar14->m_twin->m_incidentVertex << 0x20;
        pdVar16 = (dgTreeNode *)local_108->m_next;
        if (pdVar16 == (dgTreeNode *)0x0) {
          pdVar16 = (dgTreeNode *)0x0;
        }
        else {
          uVar15 = uVar25 | (long)iVar27;
          do {
            lVar22 = 8;
            if ((pdVar16->m_key <= (long)uVar15) && (lVar22 = 0x10, (long)uVar15 <= pdVar16->m_key))
            break;
            pdVar16 = *(dgTreeNode **)
                       ((long)&(pdVar16->super_dgRedBackNode)._vptr_dgRedBackNode + lVar22);
          } while (pdVar16 != (dgTreeNode *)0x0);
        }
        if (((pdVar16 != (dgTreeNode *)0x0) && (&pdVar16->m_info == pdVar14->m_twin)) &&
           (pdVar16 = dgTree<dgEdge,_long>::ReplaceKey
                                ((dgTree<dgEdge,_long> *)local_108,pdVar16,uVar25 | uVar19),
           pdVar16 == (dgTreeNode *)0x0)) {
          __assert_fail("node",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                        ,0xab9,"dgEdge *CollapseEdge(dgPolyhedra *const, dgEdge *const)");
        }
        pdVar14 = pdVar14->m_twin->m_next;
      } while (pdVar14 != edge);
      goto LAB_0087d460;
    }
  }
LAB_0087d45d:
  edge = (dgEdge *)0x0;
LAB_0087d460:
  pdVar14 = local_108;
  if (edge != (dgEdge *)0x0) {
    if (local_f0.m_size < 0) {
LAB_0087dd3f:
      __function = 
      "T &dgStack<dgVertexCollapseVertexMetric>::operator[](hacd::HaI32) [T = dgVertexCollapseVertexMetric]"
      ;
      goto LAB_0087dd35;
    }
    if (local_118.m_size < 0) goto LAB_0087dd20;
    CalculateVertexMetrics
              ((dgVertexCollapseVertexMetric *)local_f0.super_dgStackBase.m_ptr,
               (dgBigVector *)local_118.super_dgStackBase.m_ptr,edge);
    pdVar18 = edge;
    do {
      if (local_f0.m_size < 0) goto LAB_0087dd3f;
      if (local_118.m_size < 0) goto LAB_0087dd20;
      CalculateVertexMetrics
                ((dgVertexCollapseVertexMetric *)local_f0.super_dgStackBase.m_ptr,
                 (dgBigVector *)local_118.super_dgStackBase.m_ptr,pdVar18->m_twin);
      pdVar18 = pdVar18->m_twin->m_next;
    } while (pdVar18 != edge);
    iVar27 = *(int *)((long)&pdVar14->m_prev + 4) + 1;
    *(int *)((long)&pdVar14->m_prev + 4) = iVar27;
    local_c0 = edge;
    if (iVar27 == 0x7fffffff) goto LAB_0087de10;
    do {
      if (edge->m_mark == iVar27) {
        __assert_fail("ptr->m_mark != mark",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                      ,0xb1f,
                      "void dgPolyhedra::Optimize(const hacd::HaF64 *const, hacd::HaI32, hacd::HaF64)"
                     );
      }
      edge->m_mark = iVar27;
      HVar4 = edge->m_twin->m_incidentVertex;
      pdVar13 = (dgPolyhedra *)
                dgStack<dgVertexCollapseVertexMetric>::operator[](&local_f0,edge->m_incidentVertex);
      pdVar11 = dgStack<dgBigVector>::operator[](&local_118,HVar4);
      local_138._0_4_ = (undefined4)(pdVar11->super_dgTemplateVector<double>).m_x;
      local_138._4_4_ = (undefined4)(pdVar11->super_dgTemplateVector<double>).m_y;
      fVar36 = (float)(pdVar11->super_dgTemplateVector<double>).m_z;
      fVar32 = (float)(pdVar11->super_dgTemplateVector<double>).m_w;
      local_130 = (dgEdge *)CONCAT44(fVar32,fVar36);
      if ((((0x7f7fffff < (uint)ABS((float)local_138._0_4_)) ||
           (0x7f7fffff < (uint)ABS((float)local_138._4_4_))) ||
          ((NAN((float)local_138._4_4_) || ((0x7f7fffff < (uint)ABS(fVar36) || (NAN(fVar36))))))) ||
         ((0x7f7fffff < (uint)ABS(fVar32) || (NAN(fVar32))))) goto LAB_0087dd01;
      HVar34 = dgVertexCollapseVertexMetric::Evalue
                         ((dgVertexCollapseVertexMetric *)pdVar13,(dgVector *)local_138);
      pdVar14 = local_c0;
      dVar35 = -1.0;
      if ((double)HVar34 < local_f8) {
        if (local_118.m_size < 0) goto LAB_0087dd20;
        dVar35 = (double)EdgePenalty(pdVar13,(dgBigVector *)local_118.super_dgStackBase.m_ptr,edge);
      }
      if (dVar35 <= 0.0) {
        if (edge->m_userData != 0) {
          *(undefined8 *)(edge->m_userData + 8) = 0;
        }
        edge->m_userData = 0;
      }
      else {
        local_138._0_4_ = 0.0;
        local_130 = edge;
        local_100 = dgList<dgEdgeCollapseEdgeHandle>::Addtop
                              (&local_60,(dgEdgeCollapseEdgeHandle *)local_138);
        dgDownHeap<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double>::Push
                  (&local_d0,&local_100,dVar35);
        if ((((float)local_138._0_4_ != 0.0) && (local_130 != (dgEdge *)0x0)) &&
           ((dgEdgeCollapseEdgeHandle *)local_138 ==
            (dgEdgeCollapseEdgeHandle *)local_130->m_userData)) {
          local_130->m_userData = 0;
        }
      }
      edge = edge->m_twin->m_next;
    } while (edge != pdVar14);
    do {
      pdVar18 = pdVar14->m_twin;
      pdVar30 = pdVar18;
      local_38 = pdVar14;
      do {
        HVar4 = pdVar30->m_incidentVertex;
        HVar5 = pdVar30->m_twin->m_incidentVertex;
        if (pdVar30->m_mark != iVar27) {
          pdVar30->m_mark = iVar27;
          pdVar13 = (dgPolyhedra *)
                    dgStack<dgVertexCollapseVertexMetric>::operator[](&local_f0,HVar4);
          pdVar11 = dgStack<dgBigVector>::operator[](&local_118,HVar5);
          local_138._0_4_ = (undefined4)(pdVar11->super_dgTemplateVector<double>).m_x;
          local_138._4_4_ = (undefined4)(pdVar11->super_dgTemplateVector<double>).m_y;
          fVar36 = (float)(pdVar11->super_dgTemplateVector<double>).m_z;
          fVar32 = (float)(pdVar11->super_dgTemplateVector<double>).m_w;
          local_130 = (dgEdge *)CONCAT44(fVar32,fVar36);
          if (((0x7f7fffff < (uint)ABS((float)local_138._0_4_)) ||
              (0x7f7fffff < (uint)ABS((float)local_138._4_4_))) ||
             ((((NAN((float)local_138._4_4_) || ((0x7f7fffff < (uint)ABS(fVar36) || (NAN(fVar36)))))
               || (0x7f7fffff < (uint)ABS(fVar32))) || (NAN(fVar32))))) goto LAB_0087dd01;
          HVar34 = dgVertexCollapseVertexMetric::Evalue
                             ((dgVertexCollapseVertexMetric *)pdVar13,(dgVector *)local_138);
          dVar35 = -1.0;
          if ((double)HVar34 < local_f8) {
            if (local_118.m_size < 0) goto LAB_0087dd20;
            dVar35 = (double)EdgePenalty(pdVar13,(dgBigVector *)local_118.super_dgStackBase.m_ptr,
                                         pdVar30);
          }
          if (dVar35 <= 0.0) {
            if (pdVar30->m_userData != 0) {
              *(undefined8 *)(pdVar30->m_userData + 8) = 0;
            }
            pdVar30->m_userData = 0;
          }
          else {
            local_138._0_4_ = 0.0;
            local_130 = pdVar30;
            local_100 = dgList<dgEdgeCollapseEdgeHandle>::Addtop
                                  (&local_60,(dgEdgeCollapseEdgeHandle *)local_138);
            dgDownHeap<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double>::Push
                      (&local_d0,&local_100,dVar35);
            if ((((float)local_138._0_4_ != 0.0) && (local_130 != (dgEdge *)0x0)) &&
               ((dgEdgeCollapseEdgeHandle *)local_138 ==
                (dgEdgeCollapseEdgeHandle *)local_130->m_userData)) {
              local_130->m_userData = 0;
            }
          }
        }
        if (pdVar30->m_twin->m_mark != iVar27) {
          pdVar30->m_twin->m_mark = iVar27;
          pdVar13 = (dgPolyhedra *)
                    dgStack<dgVertexCollapseVertexMetric>::operator[](&local_f0,HVar5);
          pdVar11 = dgStack<dgBigVector>::operator[](&local_118,HVar4);
          local_138._0_4_ = (undefined4)(pdVar11->super_dgTemplateVector<double>).m_x;
          local_138._4_4_ = (undefined4)(pdVar11->super_dgTemplateVector<double>).m_y;
          fVar36 = (float)(pdVar11->super_dgTemplateVector<double>).m_z;
          fVar32 = (float)(pdVar11->super_dgTemplateVector<double>).m_w;
          local_130 = (dgEdge *)CONCAT44(fVar32,fVar36);
          if (((((0x7f7fffff < (uint)ABS((float)local_138._0_4_)) ||
                (0x7f7fffff < (uint)ABS((float)local_138._4_4_))) ||
               ((NAN((float)local_138._4_4_) || ((0x7f7fffff < (uint)ABS(fVar36) || (NAN(fVar36)))))
               )) || (0x7f7fffff < (uint)ABS(fVar32))) || (NAN(fVar32))) goto LAB_0087dd01;
          HVar34 = dgVertexCollapseVertexMetric::Evalue
                             ((dgVertexCollapseVertexMetric *)pdVar13,(dgVector *)local_138);
          dVar35 = -1.0;
          if ((double)HVar34 < local_f8) {
            if (local_118.m_size < 0) goto LAB_0087dd20;
            dVar35 = (double)EdgePenalty(pdVar13,(dgBigVector *)local_118.super_dgStackBase.m_ptr,
                                         pdVar30->m_twin);
          }
          if (dVar35 <= 0.0) {
            pdVar14 = pdVar30->m_twin;
            if (pdVar14->m_userData != 0) {
              *(undefined8 *)(pdVar14->m_userData + 8) = 0;
            }
          }
          else {
            local_130 = pdVar30->m_twin;
            local_138._0_4_ = 0.0;
            local_100 = dgList<dgEdgeCollapseEdgeHandle>::Addtop
                                  (&local_60,(dgEdgeCollapseEdgeHandle *)local_138);
            dgDownHeap<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double>::Push
                      (&local_d0,&local_100,dVar35);
            if ((((float)local_138._0_4_ == 0.0) || (local_130 == (dgEdge *)0x0)) ||
               (pdVar14 = local_130,
               (dgEdgeCollapseEdgeHandle *)local_138 !=
               (dgEdgeCollapseEdgeHandle *)local_130->m_userData)) goto LAB_0087d9d7;
          }
          pdVar14->m_userData = 0;
        }
LAB_0087d9d7:
        pdVar30 = pdVar30->m_twin->m_next;
      } while (pdVar30 != pdVar18);
      pdVar14 = local_38->m_twin->m_next;
    } while (pdVar14 != local_c0);
  }
  goto LAB_0087dc9d;
LAB_0087dd20:
  __function = "T &dgStack<dgBigVector>::operator[](hacd::HaI32) [T = dgBigVector]";
  goto LAB_0087dd35;
}

Assistant:

void dgPolyhedra::Optimize (const hacd::HaF64* const array, hacd::HaI32 strideInBytes, hacd::HaF64 tol)
{
	dgList <dgEdgeCollapseEdgeHandle>::dgListNode *handleNodePtr;

	hacd::HaI32 stride = hacd::HaI32 (strideInBytes / sizeof (hacd::HaF64));

#ifdef __ENABLE_SANITY_CHECK 
	HACD_ASSERT (SanityCheck ());
#endif

	hacd::HaI32 edgeCount = GetEdgeCount() * 4 + 1024 * 16;
	hacd::HaI32 maxVertexIndex = GetLastVertexIndex();

	dgStack<dgBigVector> vertexPool (maxVertexIndex); 
	dgStack<dgVertexCollapseVertexMetric> vertexMetrics (maxVertexIndex + 512); 

	dgList <dgEdgeCollapseEdgeHandle> edgeHandleList;
	dgStack<char> heapPool (2 * edgeCount * hacd::HaI32 (sizeof (hacd::HaF64) + sizeof (dgEdgeCollapseEdgeHandle*) + sizeof (hacd::HaI32))); 
	dgDownHeap<dgList <dgEdgeCollapseEdgeHandle>::dgListNode* , hacd::HaF64> bigHeapArray(&heapPool[0], heapPool.GetSizeInBytes());

	NormalizeVertex (maxVertexIndex, &vertexPool[0], array, stride);
	memset (&vertexMetrics[0], 0, maxVertexIndex * sizeof (dgVertexCollapseVertexMetric));
	CalculateAllMetrics (this, &vertexMetrics[0], &vertexPool[0]);


	hacd::HaF64 tol2 = tol * tol;
	Iterator iter (*this);
	for (iter.Begin(); iter; iter ++) {
		dgEdge* const edge = &(*iter);

		edge->m_userData = 0;
		hacd::HaI32 index0 = edge->m_incidentVertex;
		hacd::HaI32 index1 = edge->m_twin->m_incidentVertex;

		dgVertexCollapseVertexMetric &metric = vertexMetrics[index0];
		dgVector p	(&vertexPool[index1].m_x);
		hacd::HaF64 cost = metric.Evalue (p); 
		if (cost < tol2) {
			cost = EdgePenalty (&vertexPool[0], edge);

			if (cost > hacd::HaF64 (0.0f)) {
				dgEdgeCollapseEdgeHandle handle (edge);
				handleNodePtr = edgeHandleList.Addtop (handle);
				bigHeapArray.Push (handleNodePtr, cost);
			}
		}
	}


	while (bigHeapArray.GetCount()) {
		handleNodePtr = bigHeapArray[0];

		dgEdge* edge = handleNodePtr->GetInfo().m_edge;
		bigHeapArray.Pop();
		edgeHandleList.Remove (handleNodePtr);

		if (edge) {
			CalculateVertexMetrics (&vertexMetrics[0], &vertexPool[0], edge);

			hacd::HaI32 index0 = edge->m_incidentVertex;
			hacd::HaI32 index1 = edge->m_twin->m_incidentVertex;
			dgVertexCollapseVertexMetric &metric = vertexMetrics[index0];
			dgBigVector p (vertexPool[index1]);

			if ((metric.Evalue (p) < tol2) && (EdgePenalty (&vertexPool[0], edge)  > hacd::HaF64 (0.0f))) {

#ifdef __ENABLE_SANITY_CHECK 
				HACD_ASSERT (SanityCheck ());
#endif

				edge = CollapseEdge(this, edge);

#ifdef __ENABLE_SANITY_CHECK 
				HACD_ASSERT (SanityCheck ());
#endif
				if (edge) {
					// Update vertex metrics
					CalculateVertexMetrics (&vertexMetrics[0], &vertexPool[0], edge);

					// Update metrics for all surrounding vertex
					dgEdge* ptr = edge;
					do {
						CalculateVertexMetrics (&vertexMetrics[0], &vertexPool[0], ptr->m_twin);
						ptr = ptr->m_twin->m_next;
					} while (ptr != edge);

					// calculate edge cost of all incident edges
					hacd::HaI32 mark = IncLRU();
					ptr = edge;
					do {
						HACD_ASSERT (ptr->m_mark != mark);
						ptr->m_mark = mark;

						index0 = ptr->m_incidentVertex;
						index1 = ptr->m_twin->m_incidentVertex;

						dgVertexCollapseVertexMetric &metric = vertexMetrics[index0];
						dgBigVector p (vertexPool[index1]);

						hacd::HaF64 cost = hacd::HaF32 (-1.0f);
						if (metric.Evalue (p) < tol2) {
							cost = EdgePenalty (&vertexPool[0], ptr);
						}

						if (cost  > hacd::HaF64 (0.0f)) {
							dgEdgeCollapseEdgeHandle handle (ptr);
							handleNodePtr = edgeHandleList.Addtop (handle);
							bigHeapArray.Push (handleNodePtr, cost);
						} else {
							dgEdgeCollapseEdgeHandle* const handle = (dgEdgeCollapseEdgeHandle*)IntToPointer (ptr->m_userData);
							if (handle) {
								handle->m_edge = NULL;
							}
							ptr->m_userData = hacd::HaU64 (NULL);

						}

						ptr = ptr->m_twin->m_next;
					} while (ptr != edge);


					// calculate edge cost of all incident edges to a surrounding vertex
					ptr = edge;
					do {
						dgEdge* const incidentEdge = ptr->m_twin;		

						dgEdge* ptr1 = incidentEdge;
						do {
							index0 = ptr1->m_incidentVertex;
							index1 = ptr1->m_twin->m_incidentVertex;

							if (ptr1->m_mark != mark) {
								ptr1->m_mark = mark;
								dgVertexCollapseVertexMetric &metric = vertexMetrics[index0];
								dgBigVector p (vertexPool[index1]);

								hacd::HaF64 cost = hacd::HaF32 (-1.0f);
								if (metric.Evalue (p) < tol2) {
									cost = EdgePenalty (&vertexPool[0], ptr1);
								}

								if (cost  > hacd::HaF64 (0.0f)) {
									HACD_ASSERT (cost > hacd::HaF64(0.0f));
									dgEdgeCollapseEdgeHandle handle (ptr1);
									handleNodePtr = edgeHandleList.Addtop (handle);
									bigHeapArray.Push (handleNodePtr, cost);
								} else {
									dgEdgeCollapseEdgeHandle *handle;
									handle = (dgEdgeCollapseEdgeHandle*)IntToPointer (ptr1->m_userData);
									if (handle) {
										handle->m_edge = NULL;
									}
									ptr1->m_userData = hacd::HaU64 (NULL);

								}
							}

							if (ptr1->m_twin->m_mark != mark) {
								ptr1->m_twin->m_mark = mark;
								dgVertexCollapseVertexMetric &metric = vertexMetrics[index1];
								dgBigVector p (vertexPool[index0]);

								hacd::HaF64 cost = hacd::HaF32 (-1.0f);
								if (metric.Evalue (p) < tol2) {
									cost = EdgePenalty (&vertexPool[0], ptr1->m_twin);
								}

								if (cost  > hacd::HaF64 (0.0f)) {
									HACD_ASSERT (cost > hacd::HaF64(0.0f));
									dgEdgeCollapseEdgeHandle handle (ptr1->m_twin);
									handleNodePtr = edgeHandleList.Addtop (handle);
									bigHeapArray.Push (handleNodePtr, cost);
								} else {
									dgEdgeCollapseEdgeHandle *handle;
									handle = (dgEdgeCollapseEdgeHandle*) IntToPointer (ptr1->m_twin->m_userData);
									if (handle) {
										handle->m_edge = NULL;
									}
									ptr1->m_twin->m_userData = hacd::HaU64 (NULL);

								}
							}

							ptr1 = ptr1->m_twin->m_next;
						} while (ptr1 != incidentEdge);

						ptr = ptr->m_twin->m_next;
					} while (ptr != edge);
				}
			}
		}
	}
}